

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ustrcase.cpp
# Opt level: O0

UChar32 icu_63::anon_unknown_10::utf16_caseContextIterator(void *context,int8_t dir)

{
  ushort uVar1;
  int iVar2;
  uint local_2c;
  uint16_t __c2_1;
  uint16_t __c2;
  UChar32 c;
  UCaseContext *csc;
  int8_t dir_local;
  void *context_local;
  
  csc._7_1_ = dir;
  if (dir < '\0') {
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 0x14);
    *(int8_t *)((long)context + 0x1c) = dir;
  }
  else if (dir < '\x01') {
    csc._7_1_ = *(char *)((long)context + 0x1c);
  }
  else {
    *(undefined4 *)((long)context + 0xc) = *(undefined4 *)((long)context + 0x18);
    *(int8_t *)((long)context + 0x1c) = dir;
  }
  if (csc._7_1_ < '\0') {
    if (*(int *)((long)context + 8) < *(int *)((long)context + 0xc)) {
      iVar2 = *(int *)((long)context + 0xc) + -1;
      *(int *)((long)context + 0xc) = iVar2;
      local_2c = (uint)*(ushort *)(*context + (long)iVar2 * 2);
      if ((((local_2c & 0xfffffc00) == 0xdc00) &&
          (*(int *)((long)context + 8) < *(int *)((long)context + 0xc))) &&
         (uVar1 = *(ushort *)(*context + (long)(*(int *)((long)context + 0xc) + -1) * 2),
         (uVar1 & 0xfc00) == 0xd800)) {
        *(int *)((long)context + 0xc) = *(int *)((long)context + 0xc) + -1;
        local_2c = (uint)uVar1 * 0x400 + local_2c + 0xfca02400;
      }
      return local_2c;
    }
  }
  else if (*(int *)((long)context + 0xc) < *(int *)((long)context + 0x10)) {
    iVar2 = *(int *)((long)context + 0xc);
    *(int *)((long)context + 0xc) = iVar2 + 1;
    local_2c = (uint)*(ushort *)(*context + (long)iVar2 * 2);
    if ((((local_2c & 0xfffffc00) == 0xd800) &&
        (*(int *)((long)context + 0xc) != *(int *)((long)context + 0x10))) &&
       (uVar1 = *(ushort *)(*context + (long)*(int *)((long)context + 0xc) * 2),
       (uVar1 & 0xfc00) == 0xdc00)) {
      *(int *)((long)context + 0xc) = *(int *)((long)context + 0xc) + 1;
      local_2c = local_2c * 0x400 + (uint)uVar1 + 0xfca02400;
    }
    return local_2c;
  }
  return -1;
}

Assistant:

UChar32 U_CALLCONV
utf16_caseContextIterator(void *context, int8_t dir) {
    UCaseContext *csc=(UCaseContext *)context;
    UChar32 c;

    if(dir<0) {
        /* reset for backward iteration */
        csc->index=csc->cpStart;
        csc->dir=dir;
    } else if(dir>0) {
        /* reset for forward iteration */
        csc->index=csc->cpLimit;
        csc->dir=dir;
    } else {
        /* continue current iteration direction */
        dir=csc->dir;
    }

    if(dir<0) {
        if(csc->start<csc->index) {
            U16_PREV((const UChar *)csc->p, csc->start, csc->index, c);
            return c;
        }
    } else {
        if(csc->index<csc->limit) {
            U16_NEXT((const UChar *)csc->p, csc->index, csc->limit, c);
            return c;
        }
    }
    return U_SENTINEL;
}